

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ulong __n;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong i;
  ulong uVar6;
  ulong X;
  vector<unsigned_long,_std::allocator<unsigned_long>_> threads;
  vector<Argument,_std::allocator<Argument>_> args;
  
  __n = parse_arg(argc,argv);
  std::vector<Argument,_std::allocator<Argument>_>::vector(&args,__n,(allocator_type *)&threads);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&threads,__n,(allocator_type *)&X);
  X = 0;
  lVar4 = __n * 8;
  lVar3 = __n << 4;
  uVar5 = __n;
  do {
    uVar5 = uVar5 - 1;
    lVar4 = lVar4 + -8;
    if (uVar5 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Master thread");
      std::endl<char,std::char_traits<char>>(poVar2);
      X = X + 1;
      iVar1 = 0;
      for (uVar6 = 1; uVar6 < __n; uVar6 = uVar6 + 1) {
        pthread_join(threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6],(void **)0x0);
      }
      goto LAB_001024e8;
    }
    *(ulong **)
     ((long)&args.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
             super__Vector_impl_data._M_start[-1].x + lVar3) = &X;
    *(ulong *)((long)&args.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                      super__Vector_impl_data._M_start[-1].n + lVar3) = uVar5;
    iVar1 = pthread_create((pthread_t *)
                           ((long)threads.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar4),
                           (pthread_attr_t *)0x0,parallel_inc,
                           (void *)((long)&args.
                                           super__Vector_base<Argument,_std::allocator<Argument>_>.
                                           _M_impl.super__Vector_impl_data._M_start[-1].x + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (iVar1 == 0);
  poVar2 = std::operator<<((ostream *)&std::cerr,"pthread_create() terminated with code ");
  std::ostream::operator<<(poVar2,iVar1);
  iVar1 = -1;
LAB_001024e8:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<Argument,_std::allocator<Argument>_>::~_Vector_base
            (&args.super__Vector_base<Argument,_std::allocator<Argument>_>);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
  ulong N;
  try{
    N = parse_arg(argc, argv);
  }catch(std::runtime_error &err){
    std::cerr << err.what();
    return -1;
  }
  std::vector<Argument> args(N);
  std::vector<pthread_t> threads(N);
  ulong X = 0;
  for(ulong i = N - 1; i > 0; --i){
    args[i] = {&X, i};
    int ret;
    if((ret = pthread_create(threads.data() + i, nullptr, parallel_inc,
                      reinterpret_cast<void *>(args.data() + i))) != 0){
      std::cerr << "pthread_create() terminated with code " << ret;
      return -1;
    }
  }
  std::cout << "Master thread" << std::endl;
  ++X;
  for(ulong i = 1; i < N; ++i){
    pthread_join(threads[i], nullptr);
  }
  return 0;
}